

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemmodel_p.h
# Opt level: O2

QString * QFileSystemModelPrivate::myComputer(void)

{
  QString *in_RDI;
  
  QFileSystemModel::tr(in_RDI,"Computer",(char *)0x0,-1);
  return in_RDI;
}

Assistant:

inline static QString myComputer() {
        // ### TODO We should query the system to find out what the string should be
        // XP == "My Computer",
        // Vista == "Computer",
        // OS X == "Computer" (sometime user generated) "Benjamin's PowerBook G4"
#ifdef Q_OS_WIN
        return QFileSystemModel::tr("My Computer");
#else
        return QFileSystemModel::tr("Computer");
#endif
    }